

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::CheckType
          (PixieProvider *this,ByteBuffer *message_frame,uchar *expected_type)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  stringstream error_message;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = (**(message_frame->super_InputStream)._vptr_InputStream)(message_frame);
  local_1c0[0] = SUB41(iVar1,0);
  if (local_1c0[0] == (string)*expected_type) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"received a message fo type ",0x1b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)local_1c0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," when expecting a message of type ",0x22);
  local_1c0[0] = (string)*expected_type;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1c0,1);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void PixieProvider::CheckType(ByteBuffer& message_frame, const unsigned char& expected_type)
{
    unsigned char received_type = message_frame.ReadByte();

    if (received_type != expected_type)
    {
        std::stringstream error_message;
        error_message << "received a message fo type " << received_type << " when expecting a message of type " << expected_type;
        throw std::invalid_argument(error_message.str());
    }
}